

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O2

vector<duckdb::CheckpointAnalyzeResult,_true> * __thiscall
duckdb::ColumnDataCheckpointer::DetectBestCompressionMethod
          (vector<duckdb::CheckpointAnalyzeResult,_true> *__return_storage_ptr__,
          ColumnDataCheckpointer *this)

{
  vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
  *this_00;
  value_type vVar1;
  value_type vVar2;
  compression_final_analyze_t p_Var3;
  ColumnData *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  CompressionType compression_type;
  CompressionType CVar5;
  int iVar6;
  DBConfig *pDVar7;
  reference pvVar8;
  CompressionType *pCVar9;
  reference pvVar10;
  reference this_01;
  CompressionFunction *pCVar11;
  type pAVar12;
  idx_t iVar13;
  reference pvVar14;
  Logger *this_02;
  reference this_03;
  FatalException *this_04;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> _Var15;
  size_type __n;
  ulong uVar16;
  idx_t j;
  reference rVar17;
  unsigned_long in_stack_fffffffffffffe98;
  idx_t iVar18;
  ColumnDataCheckpointer *pCVar19;
  ColumnDataCheckpointer *pCVar20;
  ColumnDataCheckpointer *pCVar21;
  size_type sVar22;
  ulong local_138;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_true>
  *local_108;
  vector<bool,_true> *local_100;
  reference local_f8;
  reference local_f0;
  vector<duckdb::CompressionType,_true> forced_methods;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pDVar7 = DBConfig::GetConfig(this->db);
  local_128._M_unused._M_member_pointer = local_128._M_unused._M_member_pointer & 0xffffffffffffff00
  ;
  ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::vector
            (&forced_methods.
              super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>,
             (long)(this->checkpoint_states->
                   super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->checkpoint_states->
                   super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,
             (value_type *)local_128._M_pod_data,(allocator_type *)&stack0xfffffffffffffe9f);
  compression_type = ColumnCheckpointInfo::GetCompressionType(this->checkpoint_info);
  this_00 = &this->compression_functions;
  uVar16 = 0;
  do {
    if ((ulong)((long)(this->checkpoint_states->
                      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                      ).
                      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->checkpoint_states->
                      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                      ).
                      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar16) {
      pCVar19 = this;
      InitAnalyze(this);
      local_128._8_8_ = (CompressionFunction *)0x0;
      local_110 = ::std::
                  _Function_handler<void_(duckdb::Vector_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/table/column_data_checkpointer.cpp:175:15)>
                  ::_M_invoke;
      local_118 = ::std::
                  _Function_handler<void_(duckdb::Vector_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/table/column_data_checkpointer.cpp:175:15)>
                  ::_M_manager;
      local_128._M_unused._0_8_ = (undefined8)this;
      ScanSegments(this,(function<void_(duckdb::Vector_&,_unsigned_long)> *)&local_128);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_128);
      (__return_storage_ptr__->
      super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ).
      super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ).
      super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ).
      super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>::
      resize(&__return_storage_ptr__->
              super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
             ,(long)(this->checkpoint_states->
                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                    ).
                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->checkpoint_states->
                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                    ).
                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_100 = &this->has_changes;
      local_108 = &this->analyze_states;
      __n = 0;
      do {
        if ((ulong)((long)(this->checkpoint_states->
                          super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                          ).
                          super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->checkpoint_states->
                          super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                          ).
                          super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
          ::std::_Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::
          ~_Vector_base((_Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                         *)&forced_methods);
          return (vector<duckdb::CheckpointAnalyzeResult,_true> *)
                 &__return_storage_ptr__->
                  super_vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
          ;
        }
        rVar17 = vector<bool,_true>::get<true>(local_100,__n);
        if ((*rVar17._M_p & rVar17._M_mask) != 0) {
          sVar22 = __n;
          pvVar8 = vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
                   ::get<true>(this_00,__n);
          local_f0 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_true>
                     ::get<true>(local_108,__n);
          local_f8 = vector<duckdb::CompressionType,_true>::get<true>(&forced_methods,__n);
          pCVar20 = (ColumnDataCheckpointer *)0x0;
          local_138 = 0xffffffffffffffff;
          iVar18 = 0xffffffffffffffff;
          __n = sVar22;
          for (uVar16 = 0;
              uVar16 < (ulong)((long)(pvVar8->
                                     super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar8->
                                     super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar16 = uVar16 + 1) {
            pvVar10 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::
                      get<true>(pvVar8,uVar16);
            this_01 = vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>
                      ::get<true>(local_f0,uVar16);
            if ((this_01->
                super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>).
                _M_t.
                super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
                .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl !=
                (AnalyzeState *)0x0) {
              pCVar11 = optional_ptr<duckdb::CompressionFunction,_true>::operator->(pvVar10);
              vVar1 = pCVar11->type;
              vVar2 = *local_f8;
              pCVar11 = optional_ptr<duckdb::CompressionFunction,_true>::operator->(pvVar10);
              p_Var3 = pCVar11->final_analyze;
              pAVar12 = unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
                        ::operator*(this_01);
              this = pCVar19;
              iVar13 = (*p_Var3)(pAVar12);
              pCVar19 = this;
              if (iVar13 != 0xffffffffffffffff) {
                if ((iVar13 < iVar18) ||
                   (_Var15._M_head_impl = (AnalyzeState *)pCVar20, vVar1 == vVar2)) {
                  _Var15._M_head_impl =
                       (this_01->
                       super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
                       .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
                  (this_01->
                  super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
                  .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl =
                       (AnalyzeState *)0x0;
                  iVar18 = iVar13;
                  local_138 = uVar16;
                  if (pCVar20 != (ColumnDataCheckpointer *)0x0) {
                    (*(code *)(pCVar20->checkpoint_states->
                              super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                              ).
                              super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)();
                  }
                }
                pCVar19 = this;
                pCVar20 = (ColumnDataCheckpointer *)_Var15._M_head_impl;
                if (vVar1 == vVar2) break;
              }
            }
          }
          pCVar21 = pCVar20;
          pvVar14 = vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::get<true>
                              (this->checkpoint_states,__n);
          pCVar4 = pvVar14->_M_data->column_data;
          if (pCVar20 == (ColumnDataCheckpointer *)0x0) {
            this_04 = (FatalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)local_128._M_pod_data,
                       "No suitable compression/storage method found to store column of type %s",
                       (allocator *)&stack0xfffffffffffffe9f);
            LogicalType::ToString_abi_cxx11_(&local_70,&pCVar4->type);
            FatalException::FatalException<std::__cxx11::string>
                      (this_04,(string *)&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_70);
            __cxa_throw(this_04,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar10 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::get<true>
                              (pvVar8,local_138);
          pCVar11 = optional_ptr<duckdb::CompressionFunction,_true>::operator*(pvVar10);
          this_02 = Logger::Get(pCVar19->db);
          iVar6 = (*this_02->_vptr_Logger[2])(this_02,"duckdb.ColumnDataCheckPointer",0x1e);
          this = pCVar19;
          if ((char)iVar6 != '\0') {
            EnumUtil::ToString<duckdb::CompressionType>(&local_90,pCVar11->type);
            DataTableInfo::GetSchemaName_abi_cxx11_(&local_b0,pCVar4->info);
            DataTableInfo::GetTableName_abi_cxx11_(&local_d0,pCVar4->info);
            iVar13 = pCVar4->column_index;
            LogicalType::ToString_abi_cxx11_(&local_50,&pCVar4->type);
            params_2._M_string_length = iVar13;
            params_2._M_dataplus._M_p = (pointer)&local_d0;
            params_2.field_2._M_allocated_capacity = (size_type)&local_50;
            params_2.field_2._8_8_ = iVar18;
            params_4._M_string_length = (size_type)pCVar19;
            params_4._M_dataplus._M_p = (pointer)pCVar20;
            params_4.field_2._M_allocated_capacity = (size_type)pCVar21;
            params_4.field_2._8_8_ = __return_storage_ptr__;
            Logger::
            WriteLog<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
                      (this_02,"duckdb.ColumnDataCheckPointer",LOG_INFO,
                       "FinalAnalyze(%s) result for %s.%s.%d(%s): %d",&local_90,&local_b0,params_2,
                       in_stack_fffffffffffffe98,params_4,__n);
            ::std::__cxx11::string::~string((string *)&local_50);
            ::std::__cxx11::string::~string((string *)&local_d0);
            ::std::__cxx11::string::~string((string *)&local_b0);
            ::std::__cxx11::string::~string((string *)&local_90);
            this = pCVar19;
          }
          local_128._M_unused._M_object = pCVar20;
          local_128._8_8_ = pCVar11;
          this_03 = vector<duckdb::CheckpointAnalyzeResult,_true>::get<true>
                              (__return_storage_ptr__,__n);
          CheckpointAnalyzeResult::operator=(this_03,(CheckpointAnalyzeResult *)&local_128);
          pCVar19 = this;
          if ((ColumnDataCheckpointer *)local_128._M_unused._0_8_ != (ColumnDataCheckpointer *)0x0)
          {
            (**(code **)(*local_128._M_unused._M_object + 8))();
          }
        }
        __n = __n + 1;
      } while( true );
    }
    pvVar8 = vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_true>
             ::get<true>(this_00,uVar16);
    if (compression_type == COMPRESSION_AUTO) {
      CVar5 = (pDVar7->options).force_compression;
      if (CVar5 != COMPRESSION_AUTO) {
        CVar5 = ForceCompression(pvVar8,CVar5);
        pCVar9 = vector<duckdb::CompressionType,_true>::get<true>(&forced_methods,uVar16);
        goto LAB_01a8a26d;
      }
    }
    else {
      CVar5 = ForceCompression(pvVar8,compression_type);
      pCVar9 = vector<duckdb::CompressionType,_true>::get<true>(&forced_methods,uVar16);
LAB_01a8a26d:
      *pCVar9 = CVar5;
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

vector<CheckpointAnalyzeResult> ColumnDataCheckpointer::DetectBestCompressionMethod() {
	D_ASSERT(!compression_functions.empty());
	auto &config = DBConfig::GetConfig(db);
	vector<CompressionType> forced_methods(checkpoint_states.size(), CompressionType::COMPRESSION_AUTO);

	auto compression_type = checkpoint_info.GetCompressionType();
	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		auto &functions = compression_functions[i];
		if (compression_type != CompressionType::COMPRESSION_AUTO) {
			forced_methods[i] = ForceCompression(functions, compression_type);
		}
		if (compression_type == CompressionType::COMPRESSION_AUTO &&
		    config.options.force_compression != CompressionType::COMPRESSION_AUTO) {
			forced_methods[i] = ForceCompression(functions, config.options.force_compression);
		}
	}

	InitAnalyze();

	// scan over all the segments and run the analyze step
	ScanSegments([&](Vector &scan_vector, idx_t count) {
		for (idx_t i = 0; i < checkpoint_states.size(); i++) {
			if (!has_changes[i]) {
				continue;
			}

			auto &functions = compression_functions[i];
			auto &states = analyze_states[i];
			for (idx_t j = 0; j < functions.size(); j++) {
				auto &state = states[j];
				auto &func = functions[j];

				if (!state) {
					continue;
				}
				if (!func->analyze(*state, scan_vector, count)) {
					state = nullptr;
					func = nullptr;
				}
			}
		}
	});

	vector<CheckpointAnalyzeResult> result;
	result.resize(checkpoint_states.size());

	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		if (!has_changes[i]) {
			continue;
		}
		auto &functions = compression_functions[i];
		auto &states = analyze_states[i];
		auto &forced_method = forced_methods[i];

		unique_ptr<AnalyzeState> chosen_state;
		idx_t best_score = NumericLimits<idx_t>::Maximum();
		idx_t compression_idx = DConstants::INVALID_INDEX;

		D_ASSERT(functions.size() == states.size());
		for (idx_t j = 0; j < functions.size(); j++) {
			auto &function = functions[j];
			auto &state = states[j];

			if (!state) {
				continue;
			}

			//! Check if the method type is the forced method (if forced is used)
			bool forced_method_found = function->type == forced_method;
			// now that we have passed over all the data, we need to figure out the best method
			// we do this using the final_analyze method
			auto score = function->final_analyze(*state);

			//! The finalize method can return this value from final_analyze to indicate it should not be used.
			if (score == DConstants::INVALID_INDEX) {
				continue;
			}

			if (score < best_score || forced_method_found) {
				compression_idx = j;
				best_score = score;
				chosen_state = std::move(state);
			}
			//! If we have found the forced method, we're done
			if (forced_method_found) {
				break;
			}
		}

		auto &checkpoint_state = checkpoint_states[i];
		auto &col_data = checkpoint_state.get().column_data;
		if (!chosen_state) {
			throw FatalException("No suitable compression/storage method found to store column of type %s",
			                     col_data.type.ToString());
		}
		D_ASSERT(compression_idx != DConstants::INVALID_INDEX);

		auto &best_function = *functions[compression_idx];
		DUCKDB_LOG_INFO(db, "duckdb.ColumnDataCheckPointer", "FinalAnalyze(%s) result for %s.%s.%d(%s): %d",
		                EnumUtil::ToString(best_function.type), col_data.info.GetSchemaName(),
		                col_data.info.GetTableName(), col_data.column_index, col_data.type.ToString(), best_score);
		result[i] = CheckpointAnalyzeResult(std::move(chosen_state), best_function);
	}
	return result;
}